

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_token.c
# Opt level: O2

int get_next_token(STRING_TOKEN *token,char **delimiters,size_t n_delims)

{
  int iVar1;
  void *__ptr;
  size_t sVar2;
  LOGGER_LOG p_Var3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  
  if ((token->token_start != (char *)0x0) && (token->delimiter_start == (char *)0x0)) {
    return 0x4a;
  }
  if (n_delims >> 0x3d == 0) {
    __ptr = malloc(n_delims * 8);
    if (__ptr != (void *)0x0) {
      uVar11 = 8;
      lVar5 = 0;
      do {
        if (n_delims + lVar5 == 0) {
          pcVar8 = token->source;
          pcVar4 = token->delimiter_start;
          pcVar6 = pcVar8 + token->length;
          pcVar10 = pcVar8;
          if (pcVar4 != (char *)0x0) {
            sVar2 = strlen(token->delimiter);
            pcVar10 = pcVar4 + sVar2;
          }
          pcVar4 = pcVar10;
          do {
            if (pcVar6 <= pcVar4) {
              if (pcVar4 == pcVar6) {
                token->token_start = pcVar10;
                token->delimiter_start = (char *)0x0;
                token->delimiter = (char *)0x0;
              }
LAB_00115393:
              free(__ptr);
              return 0;
            }
            for (sVar7 = 0; sVar7 != n_delims; sVar7 = sVar7 + 1) {
              if (*pcVar4 == *delimiters[sVar7]) {
                uVar11 = *(ulong *)((long)__ptr + sVar7 * 8);
                for (uVar9 = 1;
                    ((uVar9 < uVar11 && (pcVar4 + uVar9 < pcVar6)) &&
                    (pcVar4[uVar9] == delimiters[sVar7][uVar9])); uVar9 = uVar9 + 1) {
                }
                if (uVar11 == uVar9) {
                  token->delimiter_start = pcVar4;
                  token->delimiter = delimiters[sVar7];
                  if (pcVar4 == pcVar8) {
                    pcVar10 = (char *)0x0;
                  }
                  token->token_start = pcVar10;
                  goto LAB_00115393;
                }
              }
            }
            pcVar4 = pcVar4 + 1;
          } while( true );
        }
        pcVar8 = *(char **)((long)delimiters + (uVar11 - 8));
        if (pcVar8 == (char *)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            pcVar8 = "Invalid argument (delimiter %lu is NULL)";
            iVar1 = 0x2d;
LAB_00115320:
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/string_token.c"
                      ,"get_delimiters_lengths",iVar1,1,pcVar8);
          }
LAB_0011532c:
          free(__ptr);
          goto LAB_00115334;
        }
        if (n_delims * 8 < uVar11) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            pcVar8 = "buffer overflow";
            iVar1 = 0x34;
            goto LAB_00115320;
          }
          goto LAB_0011532c;
        }
        sVar2 = strlen(pcVar8);
        *(size_t *)((long)__ptr + (uVar11 - 8)) = sVar2;
        lVar5 = lVar5 + -1;
        uVar11 = uVar11 + 8;
      } while( true );
    }
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_00115334;
    pcVar8 = "Failed to allocate array for delimiters lengths";
    iVar1 = 0x23;
  }
  else {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_00115334;
    pcVar8 = "malloc size overflow";
    iVar1 = 0x1e;
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/string_token.c"
            ,"get_delimiters_lengths",iVar1,1,pcVar8);
LAB_00115334:
  p_Var3 = xlogging_get_log_function();
  if (p_Var3 != (LOGGER_LOG)0x0) {
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/string_token.c"
              ,"get_next_token",0x52,1,"Failed to get delimiters lengths");
  }
  return 0x53;
}

Assistant:

static int get_next_token(STRING_TOKEN* token, const char** delimiters, size_t n_delims)
{
    int result;

    if (token->token_start != NULL && token->delimiter_start == NULL)
    {
        // The parser reached the end of the input string.
        result = MU_FAILURE;
    }
    else
    {
        size_t* delimiters_lengths;

        if ((delimiters_lengths = get_delimiters_lengths(delimiters, n_delims)) == NULL)
        {
            LogError("Failed to get delimiters lengths");
            result = MU_FAILURE;
        }
        else
        {
            const char* new_token_start;
            const char* current_pos;
            const char* stop_pos = (char*)token->source + token->length;
            size_t j; // iterator for the delimiters.

            if (token->delimiter_start == NULL)
            {
                // Codes_SRS_STRING_TOKENIZER_09_005: [ The source string shall be split in a token starting from the beginning of source up to occurrence of any one of the demiliters, whichever occurs first in the order provided ]
                new_token_start = (char*)token->source;
            }
            else
            {
                // Codes_SRS_STRING_TOKENIZER_09_010: [ The next token shall be selected starting from the position in source right after the previous delimiter up to occurrence of any one of demiliters, whichever occurs first in the order provided ]
                new_token_start = token->delimiter_start + strlen(token->delimiter);
            }

            current_pos = new_token_start;
            result = 0;

            while (current_pos < stop_pos)
            {
                for (j = 0; j < n_delims; j++)
                {
                    if (*current_pos == *delimiters[j])
                    {
                        size_t k;
                        for (k = 1; k < delimiters_lengths[j] && (current_pos + k) < stop_pos; k++)
                        {
                            if (*(current_pos + k) != *(delimiters[j] + k))
                            {
                                break;
                            }
                        }

                        if (k == delimiters_lengths[j])
                        {
                            token->delimiter_start = current_pos;
                            token->delimiter = delimiters[j];

                            if (token->delimiter_start == token->source)
                            {
                                // Delimiter occurs in the beginning of the source string.
                                token->token_start = NULL;
                            }
                            else
                            {
                                token->token_start = new_token_start;
                            }
                            goto SCAN_COMPLETED;
                        }
                    }
                }

                current_pos++;
            }

            // Codes_SRS_STRING_TOKENIZER_09_006: [ If the source string does not have any of the demiliters, the resulting token shall be the entire source string ]
            // Codes_SRS_STRING_TOKENIZER_09_011: [ If the source string, starting right after the position of the last delimiter found, does not have any of the demiliters, the resulting token shall be the entire remaining of the source string ]
            if (current_pos == stop_pos)
            {
                token->token_start = new_token_start;
                token->delimiter_start = NULL;
                // Codes_SRS_STRING_TOKENIZER_09_019: [ If the current token extends to the end of source, the function shall return NULL ]
                token->delimiter = NULL;
            }

SCAN_COMPLETED:
            free(delimiters_lengths);
        }
    }

    return result;
}